

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkDupTransformMiter(Abc_Ntk_t *pNtk)

{
  undefined8 *puVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  int iVar5;
  Abc_Ntk_t *pNtk_00;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  int iVar10;
  long lVar11;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                  ,0x26b,"Abc_Ntk_t *Abc_NtkDupTransformMiter(Abc_Ntk_t *)");
  }
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_STRASH,pNtk->ntkFunc,1);
  iVar10 = pNtk->nBarBufs;
  pNtk_00->nConstrs = pNtk->nConstrs;
  pNtk_00->nBarBufs = iVar10;
  pcVar6 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar6;
  pcVar6 = Extra_UtilStrsav(pNtk->pSpec);
  pNtk_00->pSpec = pcVar6;
  Abc_NtkCleanCopy(pNtk);
  pAVar7 = Abc_AigConst1(pNtk_00);
  pAVar8 = Abc_AigConst1(pNtk);
  (pAVar8->field_6).pCopy = pAVar7;
  pVVar9 = pNtk->vPis;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      Abc_NtkDupObj(pNtk_00,(Abc_Obj_t *)pVVar9->pArray[lVar11],1);
      lVar11 = lVar11 + 1;
      pVVar9 = pNtk->vPis;
    } while (lVar11 < pVVar9->nSize);
  }
  pVVar9 = pNtk->vPos;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      Abc_NtkDupObj(pNtk_00,(Abc_Obj_t *)pVVar9->pArray[lVar11],1);
      lVar11 = lVar11 + 2;
      pVVar9 = pNtk->vPos;
    } while ((int)lVar11 < pVVar9->nSize);
  }
  pVVar9 = pNtk->vBoxes;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      Abc_NtkDupBox(pNtk_00,(Abc_Obj_t *)pVVar9->pArray[lVar11],1);
      lVar11 = lVar11 + 1;
      pVVar9 = pNtk->vBoxes;
    } while (lVar11 < pVVar9->nSize);
  }
  pVVar9 = pNtk->vObjs;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      puVar1 = (undefined8 *)pVVar9->pArray[lVar11];
      if (puVar1 != (undefined8 *)0x0) {
        if (((ulong)puVar1 & 1) != 0) {
          pcVar6 = "!Abc_ObjIsComplement(pNode)";
LAB_001e491b:
          __assert_fail(pcVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                        ,0x18e,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
        }
        if (*(int *)*puVar1 != 3) {
          pcVar6 = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_001e491b;
        }
        if (*(int *)((long)puVar1 + 0x1c) == 2) {
          lVar2 = *(long *)(*(long *)((int *)*puVar1 + 8) + 8);
          pAVar7 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)((long)puVar1 + 0x14) >> 10 & 1) ^
                              *(ulong *)(*(long *)(lVar2 + (long)*(int *)puVar1[4] * 8) + 0x40)),
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)((long)puVar1 + 0x14) >> 0xb & 1) ^
                              *(ulong *)(*(long *)(lVar2 + (long)((int *)puVar1[4])[1] * 8) + 0x40))
                             );
          puVar1[8] = pAVar7;
          pVVar9 = pNtk->vObjs;
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar9->nSize);
  }
  pVVar9 = pNtk->vPos;
  iVar10 = pVVar9->nSize;
  if (0 < iVar10) {
    lVar11 = 1;
    do {
      if (iVar10 <= lVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      plVar3 = (long *)pVVar9->pArray[lVar11 + -1];
      plVar4 = (long *)pVVar9->pArray[lVar11];
      pAVar7 = Abc_AigXor((Abc_Aig_t *)pNtk_00->pManFunc,
                          (Abc_Obj_t *)
                          ((ulong)(*(uint *)((long)plVar3 + 0x14) >> 10 & 1) ^
                          *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                              (long)*(int *)plVar3[4] * 8) + 0x40)),
                          (Abc_Obj_t *)
                          ((ulong)(*(uint *)((long)plVar4 + 0x14) >> 10 & 1) ^
                          *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                              (long)*(int *)plVar4[4] * 8) + 0x40)));
      Abc_ObjAddFanin((Abc_Obj_t *)plVar3[8],pAVar7);
      pVVar9 = pNtk->vPos;
      iVar10 = pVVar9->nSize;
      iVar5 = (int)lVar11;
      lVar11 = lVar11 + 2;
    } while (iVar5 + 1 < iVar10);
  }
  pVVar9 = pNtk->vBoxes;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      plVar3 = (long *)pVVar9->pArray[lVar11];
      if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 8) {
        plVar3 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
        Abc_ObjAddFanin((Abc_Obj_t *)plVar3[8],
                        (Abc_Obj_t *)
                        ((ulong)(*(uint *)((long)plVar3 + 0x14) >> 10 & 1) ^
                        *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                            (long)*(int *)plVar3[4] * 8) + 0x40)));
        pVVar9 = pNtk->vBoxes;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar9->nSize);
  }
  Abc_AigCleanup((Abc_Aig_t *)pNtk_00->pManFunc);
  if (pNtk->vPis->nSize != pNtk_00->vPis->nSize) {
    __assert_fail("Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                  ,0x28d,"Abc_Ntk_t *Abc_NtkDupTransformMiter(Abc_Ntk_t *)");
  }
  if (pNtk->vPos->nSize != pNtk_00->vPos->nSize * 2) {
    __assert_fail("Abc_NtkPoNum(pNtk) == 2*Abc_NtkPoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                  ,0x28e,"Abc_Ntk_t *Abc_NtkDupTransformMiter(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[8] == pNtk_00->nObjCounts[8]) {
    return pNtk_00;
  }
  __assert_fail("Abc_NtkLatchNum(pNtk) == Abc_NtkLatchNum(pNtkNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                ,0x28f,"Abc_Ntk_t *Abc_NtkDupTransformMiter(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDupTransformMiter( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pObj2, * pMiter;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    pNtkNew->nConstrs   = pNtk->nConstrs;
    pNtkNew->nBarBufs   = pNtk->nBarBufs;
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // map the constant nodes
     Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 ), i++;
    Abc_NtkForEachBox( pNtk, pObj, i )
        Abc_NtkDupBox( pNtkNew, pObj, 1 );
    // copy the AND gates
    Abc_AigForEachAnd( pNtk, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // create new miters
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        pObj2 = Abc_NtkPo( pNtk, ++i );
        pMiter = Abc_AigXor( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild0Copy(pObj2) );
        Abc_ObjAddFanin( pObj->pCopy, pMiter );
    }
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
        Abc_ObjAddFanin( pObj->pCopy, Abc_ObjChild0Copy(pObj) );
    // cleanup
    Abc_AigCleanup( (Abc_Aig_t *)pNtkNew->pManFunc );
    // check that the CI/CO/latches are copied correctly
    assert( Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew) );
    assert( Abc_NtkPoNum(pNtk) == 2*Abc_NtkPoNum(pNtkNew) );
    assert( Abc_NtkLatchNum(pNtk) == Abc_NtkLatchNum(pNtkNew) );
    return pNtkNew;
}